

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFileHourly.cpp
# Opt level: O1

void __thiscall liblogger::LogFileHourly::RemoveOld(LogFileHourly *this)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  dirent *pdVar5;
  long *plVar6;
  ostream *poVar7;
  char *pcVar8;
  LogException *pLVar9;
  long *plVar10;
  int time;
  int oldest;
  string prefix;
  string file;
  time_t current;
  stringstream ss2;
  stringstream ss_1;
  tm timeinfo;
  char strtime [1024];
  int local_800;
  int local_7fc;
  DIR *local_7f8;
  string local_7f0;
  long *local_7d0;
  long local_7c8;
  long local_7c0;
  long lStack_7b8;
  LogFileHourly *local_7b0;
  string local_7a8;
  time_t local_788;
  undefined1 local_780 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_770 [23];
  undefined1 local_5f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8 [23];
  tm local_470;
  stringstream local_438 [16];
  ostream local_428 [1016];
  
  if (0 < this->m_maxage) {
    local_7f8 = opendir((this->m_dir)._M_dataplus._M_p);
    if (local_7f8 == (DIR *)0x0) {
      std::__cxx11::stringstream::stringstream(local_438);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_428,"Unable to open directory \'",0x1a);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_428,(this->m_dir)._M_dataplus._M_p,(this->m_dir)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' error:",8);
      piVar4 = __errno_location();
      pcVar8 = strerror(*piVar4);
      std::operator<<(poVar7,pcVar8);
      pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar9,(string *)local_5f8);
      __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
    }
    local_788 = ::time((time_t *)0x0);
    localtime_r(&local_788,&local_470);
    sVar3 = strftime((char *)local_438,0x400,"%Y%m%d%H",&local_470);
    if (sVar3 == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_5f8);
      poVar7 = (ostream *)(local_5f8 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"strftime failed: \'",0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' error: ",9);
      piVar4 = __errno_location();
      pcVar8 = strerror(*piVar4);
      std::operator<<(poVar7,pcVar8);
      iVar2 = closedir(local_7f8);
      if (iVar2 < 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_780);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_780 + 0x10),"Unable to close directory \'",0x1b);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_780 + 0x10),(this->m_dir)._M_dataplus._M_p,
                            (this->m_dir)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' error:",8);
        pcVar8 = strerror(*piVar4);
        std::operator<<(poVar7,pcVar8);
        pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar9,&local_7f0);
        __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
      }
      pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar9,(string *)local_780);
      __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
    }
    local_7fc = 0;
    iVar2 = __isoc99_sscanf(local_438,"%d");
    if (iVar2 != 1) {
      abort();
    }
    local_7fc = local_7fc - this->m_maxage;
    piVar4 = __errno_location();
    local_7b0 = this;
    do {
      *piVar4 = 0;
      pdVar5 = readdir(local_7f8);
      if (pdVar5 == (dirent *)0x0) break;
      local_780._0_8_ = local_780 + 0x10;
      sVar3 = strlen(pdVar5->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_780,pdVar5->d_name,pdVar5->d_name + sVar3);
      pcVar1 = (this->m_prefix)._M_dataplus._M_p;
      local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7f0,pcVar1,pcVar1 + (this->m_prefix)._M_string_length);
      std::__cxx11::string::append((char *)&local_7f0);
      iVar2 = std::__cxx11::string::compare((ulong)local_780,0,(string *)local_7f0._M_string_length)
      ;
      if (iVar2 == 0) {
        local_800 = 0;
        iVar2 = __isoc99_sscanf((pointer)(local_780._0_8_ + local_7f0._M_string_length),"%d",
                                &local_800);
        if ((iVar2 == 1) && (local_800 < local_7fc)) {
          local_5f8._0_8_ = local_5f8 + 0x10;
          pcVar1 = (this->m_dir)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5f8,pcVar1,pcVar1 + (this->m_dir)._M_string_length);
          std::__cxx11::string::append((char *)local_5f8);
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_5f8,local_780._0_8_);
          this = local_7b0;
          local_7d0 = &local_7c0;
          plVar10 = plVar6 + 2;
          if ((long *)*plVar6 == plVar10) {
            local_7c0 = *plVar10;
            lStack_7b8 = plVar6[3];
          }
          else {
            local_7c0 = *plVar10;
            local_7d0 = (long *)*plVar6;
          }
          local_7c8 = plVar6[1];
          *plVar6 = (long)plVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((undefined1 *)local_5f8._0_8_ != local_5f8 + 0x10) {
            operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
          }
          iVar2 = unlink((char *)local_7d0);
          if (iVar2 < 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_5f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_5f8 + 0x10),"Unable to remove file \'",0x17);
            poVar7 = std::operator<<((ostream *)(local_5f8 + 0x10),(char *)local_7d0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' error:",8);
            pcVar8 = strerror(*piVar4);
            std::operator<<(poVar7,pcVar8);
            pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            LogException::LogException(pLVar9,&local_7a8);
            __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
          }
          if (local_7d0 != &local_7c0) {
            operator_delete(local_7d0,local_7c0 + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_780._0_8_ != local_780 + 0x10) {
        operator_delete((void *)local_780._0_8_,local_770[0]._M_allocated_capacity + 1);
      }
    } while (pdVar5 != (dirent *)0x0);
    if (*piVar4 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_5f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_5f8 + 0x10),"readdir failed in \'",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_5f8 + 0x10),(this->m_dir)._M_dataplus._M_p,
                          (this->m_dir)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' error:",8);
      pcVar8 = strerror(*piVar4);
      std::operator<<(poVar7,pcVar8);
      iVar2 = closedir(local_7f8);
      if (iVar2 < 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_780);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_780 + 0x10),"Unable to close directory \'",0x1b);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_780 + 0x10),(this->m_dir)._M_dataplus._M_p,
                            (this->m_dir)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' error:",8);
        pcVar8 = strerror(*piVar4);
        std::operator<<(poVar7,pcVar8);
        pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar9,&local_7f0);
        __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
      }
      pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar9,(string *)local_780);
      __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
    }
    iVar2 = closedir(local_7f8);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_5f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_5f8 + 0x10),"Unable to close directory \'",0x1b);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_5f8 + 0x10),(this->m_dir)._M_dataplus._M_p,
                          (this->m_dir)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' error:",8);
      pcVar8 = strerror(*piVar4);
      std::operator<<(poVar7,pcVar8);
      pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar9,(string *)local_780);
      __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
    }
  }
  return;
}

Assistant:

void LogFileHourly::RemoveOld()
{

	if (m_maxage <= 0)
		return;

	DIR *d = opendir(m_dir.c_str());
	if (d == NULL)
	{
		std::stringstream ss;
		ss << "Unable to open directory '" << m_dir << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}

	time_t current = time(NULL);
	struct tm timeinfo;
	char strtime[1024];

	localtime_r(&current, &timeinfo);

	if (strftime(strtime, sizeof(strtime), "%Y%m%d%H", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		if (closedir(d) < 0)
		{
			std::stringstream ss2;
			ss2 << "Unable to close directory '" << m_dir << "' error:" << strerror(errno);
			throw(LogException(ss2.str()));
		}
		throw(LogException(ss.str()));
	}

	int oldest = 0;
	if (sscanf(strtime, "%d", &oldest) != 1)
		abort();
	oldest -= m_maxage;

	while(1)
	{
		errno = 0;
		struct dirent *info = readdir(d);
		if (info == NULL)
			break; //EOF
		std::string fname = info->d_name;
		std::string prefix = m_prefix + "-";
		if (fname.compare(0, prefix.length(), prefix) == 0)
		{
			//Parse and comare time.
			int time = 0;
			if (sscanf(&fname.c_str()[prefix.length()], "%d", &time) == 1)
			{
				if (time < oldest)
				{
					std::string file = m_dir + "/" + fname;
					if (unlink(file.c_str()) < 0)
					{
						std::stringstream ss;
						ss << "Unable to remove file '" << file.c_str() << "' error:" << strerror(errno);
						throw(LogException(ss.str()));
					}
				}
			}
			else
			{
				//Cant parse
			}
		}
	}

	if (errno != 0)
	{
		std::stringstream ss;
		ss << "readdir failed in '" << m_dir << "' error:" << strerror(errno);
		if (closedir(d) < 0)
		{
			std::stringstream ss2;
			ss2 << "Unable to close directory '" << m_dir << "' error:" << strerror(errno);
			throw(LogException(ss2.str()));
		}
		throw(LogException(ss.str()));
	}

	if (closedir(d) < 0)
	{
		std::stringstream ss;
		ss << "Unable to close directory '" << m_dir << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}